

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void __thiscall
clunk::HashEntry::Set
          (HashEntry *this,uint64_t entryKey,Move *bestmove,int eval,int ply,int draft,
          int primaryFlag,int otherFlags)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  
  if (entryKey == 0) {
    __assert_fail("entryKey",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x5e,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  bVar1 = Move::IsValid(bestmove);
  if (!bVar1) {
    __assert_fail("bestmove.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x5f,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  uVar2 = -eval;
  if (0 < eval) {
    uVar2 = eval;
  }
  if (31999 < uVar2) {
    __assert_fail("abs(eval) < Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x60,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  if (99 < (uint)ply) {
    __assert_fail("(ply >= 0) & (ply < MaxPlies)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x61,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  if ((uint)draft < 0x100) {
    if (2 < primaryFlag - 3U) {
      __assert_fail("(primaryFlag == HashEntry::LowerBound) || (primaryFlag == HashEntry::UpperBound) || (primaryFlag == HashEntry::ExactScore)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                    ,0x65,
                    "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                   );
    }
    if ((otherFlags & 0xffffffe7U) == 0) {
      this->key = entryKey;
      this->moveBits = bestmove->bits;
      this->depth = (uint8_t)draft;
      this->flags = (byte)otherFlags | (byte)primaryFlag;
      iVar3 = 0;
      if (eval < -31000) {
        iVar3 = ply;
      }
      iVar3 = -iVar3;
      if (31000 < eval) {
        iVar3 = ply;
      }
      this->score = (short)iVar3 + (short)eval;
      return;
    }
    __assert_fail("!(otherFlags & ~HashEntry::OtherMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x66,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  __assert_fail("(draft >= 0) && (draft < 256)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                ,0x62,
                "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
               );
}

Assistant:

void Set(const uint64_t entryKey,
           const Move& bestmove,
           const int eval,
           const int ply,
           const int draft,
           const int primaryFlag,
           const int otherFlags)
  {
    assert(entryKey);
    assert(bestmove.IsValid());
    assert(abs(eval) < Infinity);
    assert((ply >= 0) & (ply < MaxPlies));
    assert((draft >= 0) && (draft < 256));
    assert((primaryFlag == HashEntry::LowerBound) ||
           (primaryFlag == HashEntry::UpperBound) ||
           (primaryFlag == HashEntry::ExactScore));
    assert(!(otherFlags & ~HashEntry::OtherMask));

    key      = entryKey;
    moveBits = bestmove.Bits();
    depth    = static_cast<uint8_t>(draft);
    flags    = static_cast<uint8_t>(primaryFlag | otherFlags);

    // store mate-in-N scores relative to position
    if (eval > MateScore) {
      score  = static_cast<int16_t>(eval + ply);
    }
    else if (eval < -MateScore) {
      score  = static_cast<int16_t>(eval - ply);
    }
    else {
      score  = static_cast<int16_t>(eval);
    }
  }